

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

void Aig_ObjPrintVerboseCone(Aig_Man_t *p,Aig_Obj_t *pRoot,int fHaig)

{
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pObj;
  int i;
  int fHaig_00;
  Aig_Obj_t *pRoot_local;
  
  pRoot_local = pRoot;
  p_00 = Aig_ManDfsArray(p,&pRoot_local,1);
  for (i = 0; i < p_00->nSize; i = i + 1) {
    fHaig_00 = i;
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p_00,i);
    Aig_ObjPrintVerbose(pObj,fHaig_00);
    putchar(10);
  }
  putchar(10);
  Vec_PtrFree(p_00);
  return;
}

Assistant:

void Aig_ObjPrintVerboseCone( Aig_Man_t * p, Aig_Obj_t * pRoot, int fHaig )
{
    extern Vec_Ptr_t * Aig_ManDfsArray( Aig_Man_t * p, Aig_Obj_t ** pNodes, int nNodes );
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    vNodes = Aig_ManDfsArray( p, &pRoot, 1 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Aig_ObjPrintVerbose( pObj, fHaig ), printf( "\n" );
    printf( "\n" );
    Vec_PtrFree( vNodes );

}